

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O3

longlong get_int_options_inner(json_t *root,char *option_name,int *result,int should_free)

{
  json_t *json;
  longlong lVar1;
  size_t sVar2;
  
  json = json_object_get(root,option_name);
  if (json == (json_t *)0x0) {
    if (((root != (json_t *)0x0 && should_free != 0) && (root->refcount != 0xffffffffffffffff)) &&
       (sVar2 = root->refcount - 1, root->refcount = sVar2, sVar2 == 0)) {
      json_delete(root);
    }
    *result = 0;
    lVar1 = -1;
  }
  else {
    if (json->type == JSON_INTEGER) {
      lVar1 = json_integer_value(json);
      *result = 1;
      if (root == (json_t *)0x0 || should_free == 0) {
        return lVar1;
      }
    }
    else {
      *result = -1;
      fprintf(_stderr,"error: option item %s is expected to be an integer\n",option_name);
      lVar1 = -1;
      if (root == (json_t *)0x0 || should_free == 0) {
        return -1;
      }
    }
    if ((root->refcount != 0xffffffffffffffff) &&
       (sVar2 = root->refcount - 1, root->refcount = sVar2, sVar2 == 0)) {
      json_delete(root);
    }
  }
  return lVar1;
}

Assistant:

static long long get_int_options_inner(json_t * root, const char * option_name, int * result, int should_free)
{
	json_t *option_item;
	long long option_value;

	option_item = json_object_get(root, option_name);
	if (!option_item)
	{
		if (should_free)
			json_decref(root);
		*result = 0;
		return -1;
	}

	if (!json_is_integer(option_item))
	{
		*result = -1;
		fprintf(stderr, "error: option item %s is expected to be an integer\n", option_name);
		if (should_free)
			json_decref(root);
		return -1;
	}

	option_value = json_integer_value(option_item);
	*result = 1;
	if (should_free)
		json_decref(root);
	return option_value;
}